

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureType::ArrayFeatureType
          (ArrayFeatureType *this,ArrayFeatureType *from)

{
  ShapeFlexibilityCase SVar1;
  DefaultOptionalValueCase DVar2;
  int32_t value;
  ArrayFeatureType_EnumeratedShapes *this_00;
  ArrayFeatureType_EnumeratedShapes *from_00;
  ArrayFeatureType_ShapeRange *this_01;
  ArrayFeatureType_ShapeRange *from_01;
  float value_00;
  double value_01;
  ArrayFeatureType *from_local;
  ArrayFeatureType *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ArrayFeatureType_006ef4e0;
  google::protobuf::RepeatedField<long>::RepeatedField(&this->shape_,&from->shape_);
  ShapeFlexibilityUnion::ShapeFlexibilityUnion((ShapeFlexibilityUnion *)&this->ShapeFlexibility_);
  DefaultOptionalValueUnion::DefaultOptionalValueUnion
            ((DefaultOptionalValueUnion *)&this->defaultOptionalValue_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->datatype_ = from->datatype_;
  clear_has_ShapeFlexibility(this);
  SVar1 = ShapeFlexibility_case(from);
  if (SVar1 != SHAPEFLEXIBILITY_NOT_SET) {
    if (SVar1 == kEnumeratedShapes) {
      this_00 = _internal_mutable_enumeratedshapes(this);
      from_00 = _internal_enumeratedshapes(from);
      ArrayFeatureType_EnumeratedShapes::MergeFrom(this_00,from_00);
    }
    else if (SVar1 == kShapeRange) {
      this_01 = _internal_mutable_shaperange(this);
      from_01 = _internal_shaperange(from);
      ArrayFeatureType_ShapeRange::MergeFrom(this_01,from_01);
    }
  }
  clear_has_defaultOptionalValue(this);
  DVar2 = defaultOptionalValue_case(from);
  if (DVar2 != DEFAULTOPTIONALVALUE_NOT_SET) {
    if (DVar2 == kIntDefaultValue) {
      value = _internal_intdefaultvalue(from);
      _internal_set_intdefaultvalue(this,value);
    }
    else if (DVar2 == kFloatDefaultValue) {
      value_00 = _internal_floatdefaultvalue(from);
      _internal_set_floatdefaultvalue(this,value_00);
    }
    else if (DVar2 == kDoubleDefaultValue) {
      value_01 = _internal_doubledefaultvalue(from);
      _internal_set_doubledefaultvalue(this,value_01);
    }
  }
  return;
}

Assistant:

ArrayFeatureType::ArrayFeatureType(const ArrayFeatureType& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      shape_(from.shape_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  datatype_ = from.datatype_;
  clear_has_ShapeFlexibility();
  switch (from.ShapeFlexibility_case()) {
    case kEnumeratedShapes: {
      _internal_mutable_enumeratedshapes()->::CoreML::Specification::ArrayFeatureType_EnumeratedShapes::MergeFrom(from._internal_enumeratedshapes());
      break;
    }
    case kShapeRange: {
      _internal_mutable_shaperange()->::CoreML::Specification::ArrayFeatureType_ShapeRange::MergeFrom(from._internal_shaperange());
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  clear_has_defaultOptionalValue();
  switch (from.defaultOptionalValue_case()) {
    case kIntDefaultValue: {
      _internal_set_intdefaultvalue(from._internal_intdefaultvalue());
      break;
    }
    case kFloatDefaultValue: {
      _internal_set_floatdefaultvalue(from._internal_floatdefaultvalue());
      break;
    }
    case kDoubleDefaultValue: {
      _internal_set_doubledefaultvalue(from._internal_doubledefaultvalue());
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ArrayFeatureType)
}